

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::FiberBase::FiberBase
          (FiberBase *this,size_t stackSize,ExceptionOrValue *result,SourceLocation location)

{
  FiberStack *this_00;
  ExceptionOrValue *result_local;
  size_t stackSize_local;
  FiberBase *this_local;
  
  result_local = (ExceptionOrValue *)stackSize;
  stackSize_local = (size_t)this;
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  Event::Event(&this->super_Event,location);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0059ed30;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_0059ed80;
  this->state = WAITING;
  this->currentInner = (OwnPromiseNode *)0x0;
  PromiseNode::OnReadyEvent::OnReadyEvent(&this->onReadyEvent);
  heap<kj::_::FiberStack,unsigned_long&>((kj *)&this->stack,(unsigned_long *)&result_local);
  this->result = result;
  this_00 = Own<kj::_::FiberStack,_std::nullptr_t>::operator->(&this->stack);
  FiberStack::initialize(this_00,this);
  anon_unknown_173::ensureThreadCanRunFibers();
  return;
}

Assistant:

FiberBase::FiberBase(size_t stackSize, _::ExceptionOrValue& result, SourceLocation location)
    : Event(location),  state(WAITING), stack(kj::heap<FiberStack>(stackSize)), result(result) {
  stack->initialize(*this);
  ensureThreadCanRunFibers();
}